

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHTML.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (1 < argc) {
    local_44 = copy;
    local_34 = push;
    local_38 = sax;
    local_3c = noout;
    iVar3 = 1;
    local_40 = repeat;
    iVar4 = debug;
    do {
      pcVar1 = argv[iVar3];
      iVar2 = strcmp(pcVar1,"-debug");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"--debug"), iVar2 == 0)) {
        iVar4 = iVar4 + 1;
        debug = iVar4;
      }
      else {
        iVar2 = strcmp(pcVar1,"-copy");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"--copy"), iVar2 == 0)) {
          copy = local_44 + 1;
          local_44 = copy;
        }
        else {
          iVar2 = strcmp(pcVar1,"-push");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"--push"), iVar2 == 0)) {
            push = local_34 + 1;
            local_34 = push;
          }
          else {
            iVar2 = strcmp(pcVar1,"-sax");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"--sax"), iVar2 == 0)) {
              sax = local_38 + 1;
              local_38 = sax;
            }
            else {
              iVar2 = strcmp(pcVar1,"-noout");
              if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"--noout"), iVar2 == 0)) {
                noout = local_3c + 1;
                local_3c = noout;
              }
              else {
                iVar2 = strcmp(pcVar1,"-repeat");
                if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"--repeat"), iVar2 == 0)) {
                  repeat = local_40 + 1;
                  local_40 = repeat;
                }
                else {
                  iVar2 = strcmp(pcVar1,"-encode");
                  if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"--encode"), iVar2 == 0)) {
                    encoding = argv[(long)iVar3 + 1];
                    iVar3 = iVar3 + 1;
                  }
                }
              }
            }
          }
        }
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < argc);
  }
  if (1 < argc) {
    iVar4 = 1;
    local_44 = 0;
    do {
      pcVar1 = argv[iVar4];
      iVar3 = strcmp(pcVar1,"-encode");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar1,"--encode"), iVar3 == 0)) {
        iVar4 = iVar4 + 1;
      }
      else if (*pcVar1 != '-') {
        if (repeat == 0) {
          if (sax == 0) {
            parseAndPrintFile(pcVar1);
          }
          else {
            parseSAXFile(pcVar1);
          }
        }
        else if (0 < repeat) {
          iVar3 = 0;
          do {
            if (sax == 0) {
              parseAndPrintFile(argv[iVar4]);
            }
            else {
              parseSAXFile(argv[iVar4]);
            }
            iVar3 = iVar3 + 1;
          } while (SBORROW4(iVar3,repeat * 100) != iVar3 + repeat * -100 < 0);
        }
        local_44 = local_44 + 1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < argc);
    if (local_44 != 0) goto LAB_0010163f;
  }
  printf("Usage : %s [--debug] [--copy] [--copy] HTMLfiles ...\n",*argv);
  puts("\tParse the HTML files and output the result of the parsing");
  puts("\t--debug : dump a debug tree of the in-memory document");
  puts("\t--copy : used to test the internal copy implementation");
  puts("\t--sax : debug the sequence of SAX callbacks");
  puts("\t--repeat : parse the file 100 times, for timing");
  puts("\t--noout : do not print the result");
  puts("\t--push : use the push mode parser");
  puts("\t--encode encoding : output in the given encoding");
LAB_0010163f:
  xmlCleanupParser();
  xmlMemoryDump();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int i, count;
    int files = 0;

    for (i = 1; i < argc ; i++) {
#ifdef LIBXML_DEBUG_ENABLED
	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug")))
	    debug++;
	else
#endif
	    if ((!strcmp(argv[i], "-copy")) || (!strcmp(argv[i], "--copy")))
	    copy++;
#ifdef LIBXML_PUSH_ENABLED
	else if ((!strcmp(argv[i], "-push")) || (!strcmp(argv[i], "--push")))
	    push++;
#endif /* LIBXML_PUSH_ENABLED */
	else if ((!strcmp(argv[i], "-sax")) || (!strcmp(argv[i], "--sax")))
	    sax++;
	else if ((!strcmp(argv[i], "-noout")) || (!strcmp(argv[i], "--noout")))
	    noout++;
	else if ((!strcmp(argv[i], "-repeat")) ||
	         (!strcmp(argv[i], "--repeat")))
	    repeat++;
	else if ((!strcmp(argv[i], "-encode")) ||
	         (!strcmp(argv[i], "--encode"))) {
	    i++;
	    encoding = argv[i];
        }
    }
    for (i = 1; i < argc ; i++) {
	if ((!strcmp(argv[i], "-encode")) ||
	         (!strcmp(argv[i], "--encode"))) {
	    i++;
	    continue;
        }
	if (argv[i][0] != '-') {
	    if (repeat) {
		for (count = 0;count < 100 * repeat;count++) {
		    if (sax)
			parseSAXFile(argv[i]);
		    else
			parseAndPrintFile(argv[i]);
		}
	    } else {
		if (sax)
		    parseSAXFile(argv[i]);
		else
		    parseAndPrintFile(argv[i]);
	    }
	    files ++;
	}
    }
    if (files == 0) {
	printf("Usage : %s [--debug] [--copy] [--copy] HTMLfiles ...\n",
	       argv[0]);
	printf("\tParse the HTML files and output the result of the parsing\n");
#ifdef LIBXML_DEBUG_ENABLED
	printf("\t--debug : dump a debug tree of the in-memory document\n");
#endif
	printf("\t--copy : used to test the internal copy implementation\n");
	printf("\t--sax : debug the sequence of SAX callbacks\n");
	printf("\t--repeat : parse the file 100 times, for timing\n");
	printf("\t--noout : do not print the result\n");
#ifdef LIBXML_PUSH_ENABLED
	printf("\t--push : use the push mode parser\n");
#endif /* LIBXML_PUSH_ENABLED */
	printf("\t--encode encoding : output in the given encoding\n");
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(0);
}